

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator fmt::v7::
         vformat_to<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                   (iterator out,basic_string_view<char> format_str,
                   basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                   args,locale_ref loc)

{
  locale_ref *this;
  undefined1 value [16];
  undefined1 value_00 [16];
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  format_args;
  basic_string_view<char> str;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> custom;
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *pfVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  char *last;
  iterator iVar5;
  undefined8 in_stack_fffffffffffffe08;
  undefined2 in_stack_fffffffffffffe10;
  undefined6 in_stack_fffffffffffffe12;
  undefined1 local_180 [8];
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  h;
  error_handler local_119;
  undefined1 auStack_118 [8];
  format_arg arg;
  locale_ref loc_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_local;
  basic_string_view<char> format_str_local;
  iterator out_local;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_a8;
  basic_string_view<char> local_98 [3];
  undefined1 *local_68;
  locale_ref *local_60;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_58;
  char *local_50;
  char *p_1;
  writer write;
  char *pcStack_38;
  char c;
  char *p;
  char *end;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_18;
  size_t local_10;
  
  args_local.desc_ = (unsigned_long_long)args.field_1;
  loc_local.locale_ = (void *)args.desc_;
  args_local.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
        )format_str.data_;
  sVar3 = basic_string_view<char>::size((basic_string_view<char> *)&args_local.field_1);
  if (sVar3 == 2) {
    pcVar4 = basic_string_view<char>::data((basic_string_view<char> *)&args_local.field_1);
    bVar2 = detail::equal2(pcVar4,"{}");
    if (bVar2) {
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::get((format_arg *)auStack_118,
            (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             *)&loc_local,0);
      bVar2 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)auStack_118);
      if (!bVar2) {
        detail::error_handler::on_error(&local_119,"argument not found");
      }
      this = &h.context.loc_;
      local_68 = auStack_118;
      h.context.loc_.locale_ =
           (void *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      local_60 = this;
      switch(arg.value_.field_0.int128_value._8_4_) {
      case 0:
      default:
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)this);
        break;
      case 1:
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)this,
                        auStack_118._0_4_);
        break;
      case 2:
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)this,
                        auStack_118._0_4_);
        break;
      case 3:
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)this,
                        CONCAT44(auStack_118._4_4_,auStack_118._0_4_));
        break;
      case 4:
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)this,
                        CONCAT44(auStack_118._4_4_,auStack_118._0_4_));
        break;
      case 5:
        value._8_2_ = in_stack_fffffffffffffe10;
        value._0_8_ = in_stack_fffffffffffffe08;
        value._10_6_ = in_stack_fffffffffffffe12;
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)this,
                        (__int128)value);
        break;
      case 6:
        value_00._8_2_ = in_stack_fffffffffffffe10;
        value_00._0_8_ = in_stack_fffffffffffffe08;
        value_00._10_6_ = in_stack_fffffffffffffe12;
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)this,
                        (unsigned___int128)value_00);
        break;
      case 7:
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)this,
                        (bool)(auStack_118[0] & 1));
        break;
      case 8:
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)this,
                        auStack_118[0]);
        break;
      case 9:
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)this,
                        (float)auStack_118._0_4_);
        break;
      case 10:
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)this,
                        (double)CONCAT44(auStack_118._4_4_,auStack_118._0_4_));
        break;
      case 0xb:
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)this,
                        (longdouble)
                        CONCAT28(arg.value_.field_0.int_value._0_2_,
                                 CONCAT44(auStack_118._4_4_,auStack_118._0_4_)));
        break;
      case 0xc:
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)this,
                        (char *)CONCAT44(auStack_118._4_4_,auStack_118._0_4_));
        break;
      case 0xd:
        basic_string_view<char>::basic_string_view
                  (local_98,(char *)CONCAT44(auStack_118._4_4_,auStack_118._0_4_),
                   CONCAT62(arg.value_.field_0.long_long_value._2_6_,
                            arg.value_.field_0.int_value._0_2_));
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)this,
                        local_98[0]);
        break;
      case 0xe:
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char> *)this,
                        (void *)CONCAT44(auStack_118._4_4_,auStack_118._0_4_));
        break;
      case 0xf:
        custom.value._4_4_ = auStack_118._4_4_;
        custom.value._0_4_ = auStack_118._0_4_;
        custom.format._0_2_ = arg.value_.field_0.int_value._0_2_;
        custom.format._2_6_ = arg.value_.field_0.long_long_value._2_6_;
        basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::handle::handle((handle *)&local_a8,custom);
        local_58.container =
             (buffer<char> *)
             detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
                       ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *)this,
                        (handle)local_a8);
      }
      return (iterator)(back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_58.container;
    }
  }
  str.size_ = format_str.size_;
  str.data_ = (char *)args_local.field_1.values_;
  format_args.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
        )args_local.desc_;
  format_args.desc_ = (unsigned_long_long)loc_local.locale_;
  detail::
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  ::format_handler((format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)local_180,out,str,format_args,loc);
  local_18 = args_local.field_1;
  local_10 = format_str.size_;
  end = basic_string_view<char>::data((basic_string_view<char> *)&local_18);
  sVar3 = basic_string_view<char>::size((basic_string_view<char> *)&local_18);
  last = end + sVar3;
  pfVar1 = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            *)local_180;
  pcVar4 = end;
  if ((long)last - (long)end < 0x20) {
    while (pcStack_38 = pcVar4, pcStack_38 != last) {
      pcVar4 = pcStack_38 + 1;
      write.handler_._7_1_ = *pcStack_38;
      if (write.handler_._7_1_ == '{') {
        detail::
        format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::on_text((format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                   *)local_180,end,pcStack_38);
        end = detail::
              parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                        (pcStack_38,last,
                         (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                          *)local_180);
        pcVar4 = end;
      }
      else if (write.handler_._7_1_ == '}') {
        if ((pcVar4 == last) || (*pcVar4 != '}')) {
          detail::error_handler::on_error
                    ((error_handler *)local_180,"unmatched \'}\' in format string");
        }
        detail::
        format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::on_text((format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                   *)local_180,end,pcVar4);
        end = pcStack_38 + 2;
        pcVar4 = end;
      }
    }
    detail::
    format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::on_text((format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               *)local_180,end,last);
  }
  else {
    while (p_1 = (char *)pfVar1, end != last) {
      local_50 = end;
      if ((*end != '{') &&
         (bVar2 = detail::find<false,char,char_const*>(end + 1,last,'{',&local_50), !bVar2)) {
        detail::
        parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
        ::writer::operator()((writer *)&p_1,end,last);
        break;
      }
      detail::
      parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
      ::writer::operator()((writer *)&p_1,end,local_50);
      end = detail::
            parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                      (local_50,last,
                       (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                        *)local_180);
      pfVar1 = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)p_1;
    }
  }
  iVar5 = basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::out
                    ((basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
                     &h.parse_context.next_arg_id_);
  return (iterator)
         iVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::iterator out, basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    detail::locale_ref loc = detail::locale_ref()) {
  if (format_str.size() == 2 && detail::equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) detail::error_handler().on_error("argument not found");
    using iterator = typename ArgFormatter::iterator;
    return visit_format_arg(
        detail::default_arg_formatter<iterator, Char>{out, args, loc}, arg);
  }
  detail::format_handler<ArgFormatter, Char, Context> h(out, format_str, args,
                                                        loc);
  detail::parse_format_string<false>(format_str, h);
  return h.context.out();
}